

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O1

_Bool Curl_cert_hostcheck(char *match,size_t matchlen,char *hostname,size_t hostlen)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *__n;
  _Bool _Var5;
  
  if (match == (char *)0x0) {
    return false;
  }
  if (hostname == (char *)0x0) {
    return false;
  }
  if (*match == '\0') {
    return false;
  }
  if (*hostname == '\0') {
LAB_0016e20b:
    _Var5 = false;
  }
  else {
    __n = (char *)(hostlen - (hostname[hostlen - 1] == '.'));
    pcVar4 = (char *)(matchlen - (match[matchlen - 1] == '.'));
    iVar1 = strncmp(match,"*.",2);
    if (iVar1 == 0) {
      _Var5 = Curl_host_is_ipnum(hostname);
      if (_Var5) goto LAB_0016e20b;
      pcVar2 = (char *)memchr(match,0x2e,(size_t)pcVar4);
      if ((pcVar2 == (char *)0x0) ||
         (pcVar3 = (char *)memrchr(match,0x2e,(size_t)pcVar4), pcVar3 == pcVar2)) goto LAB_0016e1e2;
      pcVar3 = (char *)memchr(hostname,0x2e,(size_t)__n);
      if ((pcVar3 == (char *)0x0) ||
         (__n = hostname + ((long)__n - (long)pcVar3),
         pcVar4 = match + ((long)pcVar4 - (long)pcVar2), match = pcVar2, hostname = pcVar3,
         __n != pcVar4)) goto LAB_0016e20b;
    }
    else {
LAB_0016e1e2:
      if (__n != pcVar4) goto LAB_0016e20b;
    }
    iVar1 = curl_strnequal(hostname,match,(size_t)__n);
    _Var5 = iVar1 != 0;
  }
  return _Var5;
}

Assistant:

bool Curl_cert_hostcheck(const char *match, size_t matchlen,
                         const char *hostname, size_t hostlen)
{
  if(match && *match && hostname && *hostname)
    return hostmatch(hostname, hostlen, match, matchlen);
  return FALSE;
}